

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schedule.h
# Opt level: O0

Schedule * Schedule::GenerateRandomSchedule(Schedule *__return_storage_ptr__,DataStorage *data)

{
  vector<Group,_std::allocator<Group>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Room *classRoom;
  bool bVar1;
  reference __k;
  mapped_type *this_01;
  mapped_type *this_02;
  Day local_258;
  Time local_238;
  Teacher local_210;
  Subject local_1f0;
  Group local_1b8;
  Class local_170;
  Room *local_98;
  Room *room;
  Teacher *teacher;
  Subject *local_78;
  Subject *subject;
  reference pbStack_68;
  int lessonNum;
  Day *day;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Group *group;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Group,_std::allocator<Group>_> *__range1;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  *schedule;
  DataStorage *data_local;
  Schedule *scheduleObj;
  
  Schedule(__return_storage_ptr__);
  this = data->groups;
  __end1 = std::vector<Group,_std::allocator<Group>_>::begin(this);
  group = (Group *)std::vector<Group,_std::allocator<Group>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Group_*,_std::vector<Group,_std::allocator<Group>_>_>
                                     *)&group), bVar1) {
    __k = __gnu_cxx::__normal_iterator<const_Group_*,_std::vector<Group,_std::allocator<Group>_>_>::
          operator*(&__end1);
    this_00 = data->days;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    day = (Day *)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&day), bVar1) {
      pbStack_68 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
      for (subject._4_4_ = 0; (ulong)(long)subject._4_4_ < data->LESSONS_PER_DAY;
          subject._4_4_ = subject._4_4_ + 1) {
        local_78 = GetRandom<Subject>(&__k->subjects);
        room = (Room *)GetRandom<Teacher>(&local_78->teachers);
        local_98 = GetRandomRoom(data->rooms,__k->size);
        this_01 = std::
                  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                  ::operator[](&__return_storage_ptr__->schedule,__k);
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
                  ::operator[](this_01,pbStack_68);
        Group::Group(&local_1b8,__k);
        Subject::Subject(&local_1f0,local_78);
        classRoom = local_98;
        Teacher::Teacher(&local_210,(Teacher *)room);
        std::__cxx11::string::string((string *)&local_258,(string *)pbStack_68);
        Time::Time(&local_238,&local_258,(long)subject._4_4_);
        Class::Class(&local_170,&local_1b8,&local_1f0,classRoom,&local_210,&local_238);
        std::vector<Class,_std::allocator<Class>_>::push_back(this_02,&local_170);
        Class::~Class(&local_170);
        Time::~Time(&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        Teacher::~Teacher(&local_210);
        Subject::~Subject(&local_1f0);
        Group::~Group(&local_1b8);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<const_Group_*,_std::vector<Group,_std::allocator<Group>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Schedule GenerateRandomSchedule(const DataStorage& data) {
        Schedule scheduleObj;
        map<Group, Schedule_Per_Group>& schedule = scheduleObj.schedule;

        for (const Group& group : data.groups) {
            for (const Day& day : data.days) {
                for (int lessonNum = 0; lessonNum < data.LESSONS_PER_DAY; ++lessonNum) {
                    const Subject& subject = GetRandom(group.subjects);
                    const Teacher& teacher = GetRandom(subject.teachers);
                    const Room& room = GetRandomRoom(data.rooms, group.size);
                    schedule[group][day].push_back(Class(group, subject, room, teacher, Time(day, lessonNum)));
                }
            }
        }

        return scheduleObj;
    }